

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory.cpp
# Opt level: O0

int main(void)

{
  pointer pHVar1;
  allocator<char> local_f1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  DrinkWithVolumeFactory dwv;
  string local_88 [32];
  undefined1 local_68 [24];
  undefined1 local_50 [8];
  DrinkFactory df;
  unique_ptr<Tea,_std::default_delete<Tea>_> tea;
  
  make_drink<Tea>();
  DrinkFactory::DrinkFactory((DrinkFactory *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"coffee",(allocator<char> *)((long)&dwv.factories._M_h._M_single_bucket + 7));
  DrinkFactory::make_drink((DrinkFactory *)local_68,(string *)local_50);
  pHVar1 = std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>::operator->
                     ((unique_ptr<HotDrink,_std::default_delete<HotDrink>_> *)local_68);
  (**pHVar1->_vptr_HotDrink)(0x42c80000);
  std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>::~unique_ptr
            ((unique_ptr<HotDrink,_std::default_delete<HotDrink>_> *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&dwv.factories._M_h._M_single_bucket + 7));
  DrinkWithVolumeFactory::DrinkWithVolumeFactory((DrinkWithVolumeFactory *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"tea",&local_f1);
  DrinkWithVolumeFactory::make((DrinkWithVolumeFactory *)local_d0,(string *)local_c8);
  std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>::~unique_ptr
            ((unique_ptr<HotDrink,_std::default_delete<HotDrink>_> *)local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  DrinkWithVolumeFactory::~DrinkWithVolumeFactory((DrinkWithVolumeFactory *)local_c8);
  DrinkFactory::~DrinkFactory((DrinkFactory *)local_50);
  std::unique_ptr<Tea,_std::default_delete<Tea>_>::~unique_ptr
            ((unique_ptr<Tea,_std::default_delete<Tea>_> *)&df.factories._M_h._M_single_bucket);
  return 0;
}

Assistant:

int main()
{
	auto tea{make_drink<Tea>()};

	DrinkFactory df;
	df.make_drink("coffee")->prepare(100);
	
	DrinkWithVolumeFactory dwv;
	dwv.make("tea");

	return 0;
}